

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O0

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  void *pvVar1;
  int *piVar2;
  long lVar3;
  char *local_78;
  UINT8 local_69;
  size_t sStack_68;
  char resVal;
  size_t wrtBytes;
  char *outPtr;
  char *inPtr;
  size_t remBytesOut;
  size_t remBytesIn;
  size_t outBufSize;
  char *inStr_local;
  size_t inSize_local;
  char **outStr_local;
  size_t *outSize_local;
  CPCONV *cpc_local;
  
  outBufSize = (size_t)inStr;
  inStr_local = (char *)inSize;
  inSize_local = (size_t)outStr;
  outStr_local = (char **)outSize;
  outSize_local = (size_t *)cpc;
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  if (inStr_local == (char *)0x0) {
    local_78 = (char *)strlen((char *)outBufSize);
  }
  else {
    local_78 = inStr_local;
  }
  remBytesOut = (size_t)local_78;
  outPtr = (char *)outBufSize;
  if (local_78 == (char *)0x0) {
    *outStr_local = (char *)0x0;
    cpc_local._7_1_ = '\x02';
  }
  else {
    if (*(long *)inSize_local == 0) {
      remBytesIn = (ulong)((long)local_78 * 3) >> 1;
      pvVar1 = malloc(remBytesIn);
      *(void **)inSize_local = pvVar1;
    }
    else {
      remBytesIn = (size_t)*outStr_local;
    }
    inPtr = (char *)remBytesIn;
    wrtBytes = *(size_t *)inSize_local;
    local_69 = '\0';
    sStack_68 = iconv((iconv_t)outSize_local[2],&outPtr,&remBytesOut,(char **)&wrtBytes,
                      (size_t *)&inPtr);
    while (sStack_68 == 0xffffffffffffffff) {
      piVar2 = __errno_location();
      if ((*piVar2 == 0x54) || (piVar2 = __errno_location(), *piVar2 == 0x16)) {
        local_69 = 0x80;
        piVar2 = __errno_location();
        if ((*piVar2 == 0x16) && (remBytesOut < 2)) {
          iconv((iconv_t)outSize_local[2],(char **)0x0,(size_t *)0x0,(char **)&wrtBytes,
                (size_t *)&inPtr);
          local_69 = '\x01';
        }
        break;
      }
      lVar3 = wrtBytes - *(long *)inSize_local;
      remBytesIn = remBytesOut * 2 + remBytesIn;
      pvVar1 = realloc(*(void **)inSize_local,remBytesIn);
      *(void **)inSize_local = pvVar1;
      wrtBytes = *(long *)inSize_local + lVar3;
      inPtr = (char *)(remBytesIn - lVar3);
      sStack_68 = iconv((iconv_t)outSize_local[2],&outPtr,&remBytesOut,(char **)&wrtBytes,
                        (size_t *)&inPtr);
    }
    *outStr_local = (char *)(wrtBytes - *(long *)inSize_local);
    cpc_local._7_1_ = local_69;
  }
  return cpc_local._7_1_;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	remBytesIn = inSize ? inSize : strlen(inStr);
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x02;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * 3 / 2;
		*outStr = (char*)malloc(outBufSize);
	}
	else
	{
		outBufSize = *outSize;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		if (errno == EILSEQ || errno == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (errno == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;
			}
			break;
		}
		// errno == E2BIG
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}